

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O0

WebSocketMsg * __thiscall asl::WebSocketMsg::fix(WebSocketMsg *this)

{
  int iVar1;
  uchar local_11;
  WebSocketMsg *local_10;
  WebSocketMsg *this_local;
  
  local_11 = '\0';
  local_10 = this;
  Array<unsigned_char>::operator<<(&this->_data,&local_11);
  iVar1 = Array<unsigned_char>::length(&this->_data);
  Array<unsigned_char>::resize(&this->_data,iVar1 + -1);
  return this;
}

Assistant:

WebSocketMsg& WebSocketMsg::fix()
{
	_data << byte(0);
	_data.resize(_data.length() - 1);
	return *this;
}